

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intermission_parse.cpp
# Opt level: O1

void __thiscall
FMapInfoParser::ParseIntermissionAction(FMapInfoParser *this,FIntermissionDescriptor *desc)

{
  uint uVar1;
  bool bVar2;
  int iVar3;
  FIntermissionActionTextscreen *this_00;
  
  FScanner::MustGetToken(&this->sc,0x101);
  bVar2 = FScanner::Compare(&this->sc,"image");
  if (bVar2) {
    this_00 = (FIntermissionActionTextscreen *)operator_new(0x60);
    (this_00->super_FIntermissionAction)._vptr_FIntermissionAction =
         (_func_int **)&PTR__FIntermissionAction_006f0740;
    (this_00->super_FIntermissionAction).mMusic.Chars = FString::NullString.Nothing;
    (this_00->super_FIntermissionAction).mBackground.Chars = FString::NullString.Nothing;
    (this_00->super_FIntermissionAction).mPalette.Chars = FString::NullString.Nothing;
    (this_00->super_FIntermissionAction).mSound.Chars = FString::NullString.Nothing;
    FString::NullString.RefCount = FString::NullString.RefCount + 4;
    (this_00->super_FIntermissionAction).mOverlays.Array = (FIntermissionPatch *)0x0;
    (this_00->super_FIntermissionAction).mOverlays.Most = 0;
    (this_00->super_FIntermissionAction).mOverlays.Count = 0;
    (this_00->super_FIntermissionAction).mSize = 0x60;
    (this_00->super_FIntermissionAction).mClass = DIntermissionScreen::RegistrationInfo.MyClass;
    (this_00->super_FIntermissionAction).mFlatfill = false;
    (this_00->super_FIntermissionAction).mMusicLooping = true;
    (this_00->super_FIntermissionAction).mMusicOrder = 0;
    (this_00->super_FIntermissionAction).mCdTrack = 0;
    (this_00->super_FIntermissionAction).mCdId = 0;
    (this_00->super_FIntermissionAction).mDuration = 0;
  }
  else {
    bVar2 = FScanner::Compare(&this->sc,"scroller");
    if (bVar2) {
      this_00 = (FIntermissionActionTextscreen *)operator_new(0x78);
      FIntermissionActionScroller::FIntermissionActionScroller
                ((FIntermissionActionScroller *)this_00);
    }
    else {
      bVar2 = FScanner::Compare(&this->sc,"cast");
      if (bVar2) {
        this_00 = (FIntermissionActionTextscreen *)operator_new(0x80);
        FIntermissionActionCast::FIntermissionActionCast((FIntermissionActionCast *)this_00);
      }
      else {
        bVar2 = FScanner::Compare(&this->sc,"Fader");
        if (bVar2) {
          this_00 = (FIntermissionActionTextscreen *)operator_new(0x68);
          FIntermissionActionFader::FIntermissionActionFader((FIntermissionActionFader *)this_00);
        }
        else {
          bVar2 = FScanner::Compare(&this->sc,"Wiper");
          if (bVar2) {
            this_00 = (FIntermissionActionTextscreen *)operator_new(0x68);
            FIntermissionActionWiper::FIntermissionActionWiper((FIntermissionActionWiper *)this_00);
          }
          else {
            bVar2 = FScanner::Compare(&this->sc,"TextScreen");
            if (bVar2) {
              this_00 = (FIntermissionActionTextscreen *)operator_new(0x80);
              FIntermissionActionTextscreen::FIntermissionActionTextscreen(this_00);
            }
            else {
              bVar2 = FScanner::Compare(&this->sc,"GotoTitle");
              if (bVar2) {
                this_00 = (FIntermissionActionTextscreen *)operator_new(0x60);
                FIntermissionAction::FIntermissionAction((FIntermissionAction *)this_00);
                (this_00->super_FIntermissionAction).mClass = (PClass *)0xfffffffffffffffe;
              }
              else {
                bVar2 = FScanner::Compare(&this->sc,"Link");
                if (bVar2) {
                  FScanner::MustGetToken(&this->sc,0x3d);
                  FScanner::MustGetToken(&this->sc,0x101);
                  iVar3 = FName::NameManager::FindName(&FName::NameData,(this->sc).String,false);
                  (desc->mLink).Index = iVar3;
                  return;
                }
                this_00 = (FIntermissionActionTextscreen *)0x0;
                FScanner::ScriptMessage
                          (&this->sc,"Unknown intermission type \'%s\'",(this->sc).String);
              }
            }
          }
        }
      }
    }
  }
  FScanner::MustGetToken(&this->sc,0x7b);
  bVar2 = FScanner::CheckToken(&this->sc,0x7d);
  do {
    if (bVar2) {
      if (this_00 != (FIntermissionActionTextscreen *)0x0) {
        TArray<FIntermissionAction_*,_FIntermissionAction_*>::Grow
                  (&(desc->mActions).super_TArray<FIntermissionAction_*,_FIntermissionAction_*>,1);
        uVar1 = (desc->mActions).super_TArray<FIntermissionAction_*,_FIntermissionAction_*>.Count;
        (desc->mActions).super_TArray<FIntermissionAction_*,_FIntermissionAction_*>.Array[uVar1] =
             &this_00->super_FIntermissionAction;
        (desc->mActions).super_TArray<FIntermissionAction_*,_FIntermissionAction_*>.Count =
             uVar1 + 1;
      }
      return;
    }
    bVar2 = FScanner::CheckToken(&this->sc,0x14a);
    if (!bVar2) {
      FScanner::MustGetToken(&this->sc,0x101);
    }
    if (this_00 == (FIntermissionActionTextscreen *)0x0) {
LAB_0030375e:
      SkipToNext(this);
    }
    else {
      iVar3 = (*(this_00->super_FIntermissionAction)._vptr_FIntermissionAction[2])(this_00,this);
      if ((char)iVar3 == '\0') {
        FScanner::ScriptMessage(&this->sc,"Unknown key name \'%s\'\n",(this->sc).String);
        goto LAB_0030375e;
      }
    }
    bVar2 = FScanner::CheckToken(&this->sc,0x7d);
  } while( true );
}

Assistant:

void FMapInfoParser::ParseIntermissionAction(FIntermissionDescriptor *desc)
{
	FIntermissionAction *ac = NULL;

	sc.MustGetToken(TK_Identifier);
	if (sc.Compare("image"))
	{
		ac = new FIntermissionAction;
	}
	else if (sc.Compare("scroller"))
	{
		ac = new FIntermissionActionScroller;
	}
	else if (sc.Compare("cast"))
	{
		ac = new FIntermissionActionCast;
	}
	else if (sc.Compare("Fader"))
	{
		ac = new FIntermissionActionFader;
	}
	else if (sc.Compare("Wiper"))
	{
		ac = new FIntermissionActionWiper;
	}
	else if (sc.Compare("TextScreen"))
	{
		ac = new FIntermissionActionTextscreen;
	}
	else if (sc.Compare("GotoTitle"))
	{
		ac = new FIntermissionAction;
		ac->mClass = TITLE_ID;
	}
	else if (sc.Compare("Link"))
	{
		sc.MustGetToken('=');
		sc.MustGetToken(TK_Identifier);
		desc->mLink = sc.String;
		return;
	}
	else
	{
		sc.ScriptMessage("Unknown intermission type '%s'", sc.String);
	}

	sc.MustGetToken('{');
	while (!sc.CheckToken('}'))
	{
		bool success = false;
		if (!sc.CheckToken(TK_Sound))
		{
			sc.MustGetToken(TK_Identifier);
		}
		if (ac != NULL)
		{
			success = ac->ParseKey(sc);
			if (!success)
			{
				sc.ScriptMessage("Unknown key name '%s'\n", sc.String);
			}
		}
		if (!success) SkipToNext();
	}
	if (ac != NULL) desc->mActions.Push(ac);
}